

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::putIntoGlobalNamesMap
          (CheckerVisitor *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
          *map,DiagnosticsId diag,SQChar *name,Node *d)

{
  iterator iVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_bool>
  pVar4;
  string key;
  string sourcenameCache;
  value_type local_e0;
  key_type local_c8;
  _Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> local_a8;
  key_type local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
  local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,this->_ctx->_sourceName,(allocator<char> *)&local_68);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)fileNames_abi_cxx11_,&local_88);
  if (iVar1._M_node == (_Base_ptr)(fileNames_abi_cxx11_ + 8)) {
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)fileNames_abi_cxx11_,&local_88);
    iVar1._M_node = (_Base_ptr)pVar3.first._M_node;
  }
  local_e0.filename = *(char **)(iVar1._M_node + 1);
  local_e0.line = (d->_coordinates).lineStart;
  local_e0.column = (d->_coordinates).columnStart;
  local_e0.diagSilenced =
       SQCompilationContext::isDisabled(this->_ctx,diag,local_e0.line,local_e0.column);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,name,(allocator<char> *)&local_68);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
          ::find(&map->_M_t,&local_c8);
  if ((_Rb_tree_header *)iVar2._M_node == &(map->_M_t)._M_impl.super__Rb_tree_header) {
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_true>
              (&local_68,&local_c8,
               (vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               &local_a8);
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>>
            ::
            _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>>
                        *)map,&local_68);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
    ::~pair(&local_68);
    std::_Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::
    ~_Vector_base(&local_a8);
    std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::push_back
              ((vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               (pVar4.first._M_node._M_node + 2),&local_e0);
  }
  else {
    std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::push_back
              ((vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *)
               (iVar2._M_node + 2),&local_e0);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void CheckerVisitor::putIntoGlobalNamesMap(std::map<std::string, std::vector<IdLocation>> &map, enum DiagnosticsId diag, const SQChar *name, const Node *d) {

  std::string sourcenameCache(_ctx.sourceName());

  auto fnIt = fileNames.find(sourcenameCache);
  IdLocation loc;

  if (fnIt == fileNames.end()) {
    auto it2 = fileNames.insert(sourcenameCache);
    loc.filename = it2.first->c_str();
  }
  else {
    loc.filename = fnIt->c_str();
  }

  loc.line = d->lineStart();
  loc.column = d->columnStart();
  loc.diagSilenced = _ctx.isDisabled(diag, loc.line, loc.column);

  std::string key(name);

  auto it = map.find(key);

  if (it != map.end()) {
    it->second.push_back(loc);
  }
  else {
    auto it2 = map.insert({ key, std::vector<IdLocation>() });
    it2.first->second.push_back(loc);
  }
}